

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O3

bool Diligent::VerifyConstantBufferBinding<Diligent::BufferGLImpl>
               (PipelineResourceDesc *ResDesc,BindResourceInfo *BindInfo,BufferGLImpl *pBufferImpl,
               IDeviceObject *pCachedBuffer,Uint64 CachedBaseOffset,Uint64 CachedRangeSize,
               char *SignatureName)

{
  Uint64 *Args;
  Uint64 *Args_6;
  char *pcVar1;
  pointer pcVar2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  RenderDeviceGLImpl *pRVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_02;
  Uint64 UVar7;
  Uint32 ArrayIndex;
  string *Args_2;
  char (*Args_2_00) [67];
  pointer pcVar8;
  char (*in_stack_fffffffffffffdc8) [30];
  string msg;
  Uint32 OffsetAlignment;
  Diligent local_1f8;
  char acStack_1f7 [15];
  long local_1e8 [2];
  BufferDesc *local_1d8;
  Uint64 local_1d0;
  IDeviceObject *local_1c8;
  Uint64 local_1c0;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_1d0 = CachedBaseOffset;
  local_1c8 = pCachedBuffer;
  local_1c0 = CachedRangeSize;
  bVar3 = VerifyResourceBinding<Diligent::BufferGLImpl>
                    ("buffer",ResDesc,BindInfo,pBufferImpl,pCachedBuffer,SignatureName);
  ArrayIndex = (Uint32)pCachedBuffer;
  if (pBufferImpl == (BufferGLImpl *)0x0) {
    if (BindInfo->BufferRangeSize != 0 || BindInfo->BufferBaseOffset != 0) {
      FormatString<char[55]>
                ((string *)&ss,
                 (char (*) [55])"Non-empty buffer range is specified for a null buffer.");
      DebugAssertionFailed
                (_ss,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x139);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_ss != local_1a8) {
        operator_delete(_ss,local_1a8[0]._M_allocated_capacity + 1);
      }
    }
  }
  else {
    local_1d8 = &(pBufferImpl->super_BufferBase<Diligent::EngineGLImplTraits>).
                 super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                 .m_Desc;
    if (((pBufferImpl->super_BufferBase<Diligent::EngineGLImplTraits>).
         super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
         .m_Desc.BindFlags & BIND_UNIFORM_BUFFER) == BIND_NONE) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8[0]._M_local_buf,"Error binding buffer \'",0x16);
      pcVar1 = (local_1d8->super_DeviceObjectAttribs).Name;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)local_1a8 +
                        (int)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18));
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8[0]._M_local_buf,pcVar1,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8[0]._M_local_buf,"\' to variable \'",0xf);
      GetShaderResourcePrintName_abi_cxx11_
                (&msg,(Diligent *)ResDesc->Name,(char *)(ulong)ResDesc->ArraySize,
                 BindInfo->ArrayIndex,ArrayIndex);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8[0]._M_local_buf,msg._M_dataplus._M_p,
                          msg._M_string_length);
      local_1f8 = (Diligent)0x27;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_1f8,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      if (SignatureName != (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8[0]._M_local_buf," defined by signature \'",0x17);
        sVar4 = strlen(SignatureName);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8[0]._M_local_buf,SignatureName,sVar4);
        msg._M_dataplus._M_p._0_1_ = 0x27;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8[0]._M_local_buf,(char *)&msg,1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8[0]._M_local_buf,
                 ". The buffer was not created with BIND_UNIFORM_BUFFER flag.",0x3b);
      std::__cxx11::stringbuf::str();
      FormatString<std::__cxx11::string>(&msg,&local_1f8,Args_00);
      if ((long *)CONCAT71(acStack_1f7._0_7_,local_1f8) != local_1e8) {
        operator_delete((long *)CONCAT71(acStack_1f7._0_7_,local_1f8),local_1e8[0] + 1);
      }
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0xf8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      bVar3 = false;
    }
    if (((pBufferImpl->super_BufferBase<Diligent::EngineGLImplTraits>).
         super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
         .m_Desc.Usage == USAGE_DYNAMIC) &&
       ((ResDesc->Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) != PIPELINE_RESOURCE_FLAG_NONE)
       ) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8[0]._M_local_buf,"Error binding USAGE_DYNAMIC buffer \'",0x24);
      pcVar1 = (local_1d8->super_DeviceObjectAttribs).Name;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)local_1a8 +
                        (int)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18));
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8[0]._M_local_buf,pcVar1,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8[0]._M_local_buf,"\' to variable \'",0xf);
      GetShaderResourcePrintName_abi_cxx11_
                (&msg,(Diligent *)ResDesc->Name,(char *)(ulong)ResDesc->ArraySize,
                 BindInfo->ArrayIndex,ArrayIndex);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8[0]._M_local_buf,msg._M_dataplus._M_p,
                          msg._M_string_length);
      local_1f8 = (Diligent)0x27;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_1f8,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      if (SignatureName != (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8[0]._M_local_buf," defined by signature \'",0x17);
        sVar4 = strlen(SignatureName);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8[0]._M_local_buf,SignatureName,sVar4);
        msg._M_dataplus._M_p._0_1_ = 0x27;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8[0]._M_local_buf,(char *)&msg,1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8[0]._M_local_buf,
                 ". The variable was initialized with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag."
                 ,0x53);
      std::__cxx11::stringbuf::str();
      FormatString<std::__cxx11::string>(&msg,&local_1f8,Args_01);
      if ((long *)CONCAT71(acStack_1f7._0_7_,local_1f8) != local_1e8) {
        operator_delete((long *)CONCAT71(acStack_1f7._0_7_,local_1f8),local_1e8[0] + 1);
      }
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x106);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      bVar3 = false;
    }
    pcVar8 = (pointer)(BindInfo->BufferRangeSize + BindInfo->BufferBaseOffset);
    Args = &BindInfo->BufferBaseOffset;
    Args_6 = &(pBufferImpl->super_BufferBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
              .m_Desc.Size;
    pcVar2 = (pointer)(pBufferImpl->super_BufferBase<Diligent::EngineGLImplTraits>).
                      super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                      .m_Desc.Size;
    if (pcVar2 < pcVar8) {
      Args_2 = &msg;
      msg._M_dataplus._M_p = pcVar8;
      FormatString<char[15],unsigned_long,char[3],unsigned_long,char[25],char_const*,char[11],unsigned_long,char[30]>
                ((string *)&ss,(Diligent *)"Buffer range [",(char (*) [15])Args,
                 (unsigned_long *)0x91f0a4,(char (*) [3])Args_2,
                 (unsigned_long *)") specified for buffer \'",(char (*) [25])local_1d8,
                 (char **)"\' of size ",(char (*) [11])Args_6,
                 (unsigned_long *)" is out of the buffer bounds.",in_stack_fffffffffffffdc8);
      ArrayIndex = (Uint32)Args_2;
      DebugAssertionFailed
                (_ss,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x10f);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_ss != local_1a8) {
        operator_delete(_ss,local_1a8[0]._M_allocated_capacity + 1);
      }
      bVar3 = false;
    }
    pRVar6 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
             ::GetDevice((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                          *)pBufferImpl);
    OffsetAlignment =
         (pRVar6->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_AdapterInfo.Buffer.
         ConstantBufferOffsetAlignment;
    if (OffsetAlignment == 0) {
      FormatString<char[26],char[21]>
                ((string *)&ss,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x905e58,
                 (char (*) [21])(ulong)OffsetAlignment);
      DebugAssertionFailed
                (_ss,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x115);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_ss != local_1a8) {
        operator_delete(_ss,local_1a8[0]._M_allocated_capacity + 1);
      }
    }
    if (*Args % (ulong)OffsetAlignment != 0) {
      Args_2_00 = (char (*) [67])&OffsetAlignment;
      FormatString<char[21],unsigned_long,char[67],unsigned_int,char[3]>
                ((string *)&ss,(Diligent *)"Buffer base offset (",(char (*) [21])Args,
                 (unsigned_long *)
                 ") is not a multiple of required constant buffer offset alignment (",Args_2_00,
                 (uint *)0x91fe20,(char (*) [3])in_stack_fffffffffffffdc8);
      ArrayIndex = (Uint32)Args_2_00;
      DebugAssertionFailed
                (_ss,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x119);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_ss != local_1a8) {
        operator_delete(_ss,local_1a8[0]._M_allocated_capacity + 1);
      }
      bVar3 = false;
    }
    if (((pcVar8 <= pcVar2) && (local_1c8 != (IDeviceObject *)0x0)) &&
       (ResDesc->VarType != SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC)) {
      UVar7 = *Args_6;
      local_1c8 = (IDeviceObject *)(UVar7 - local_1d0);
      if (local_1c0 != 0) {
        local_1c8 = (IDeviceObject *)local_1c0;
      }
      UVar7 = UVar7 - BindInfo->BufferBaseOffset;
      if (BindInfo->BufferRangeSize != 0) {
        UVar7 = BindInfo->BufferRangeSize;
      }
      if ((BindInfo->BufferBaseOffset != local_1d0) || (local_1c8 != (IDeviceObject *)UVar7)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8[0]._M_local_buf,"Error binding buffer \'",0x16);
        pcVar1 = (local_1d8->super_DeviceObjectAttribs).Name;
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)local_1a8 +
                          (int)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18));
        }
        else {
          sVar4 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,pcVar1,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8[0]._M_local_buf,"\' to variable \'",0xf);
        GetShaderResourcePrintName_abi_cxx11_
                  (&msg,(Diligent *)ResDesc->Name,(char *)(ulong)ResDesc->ArraySize,
                   BindInfo->ArrayIndex,ArrayIndex);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8[0]._M_local_buf,msg._M_dataplus._M_p,
                            msg._M_string_length);
        local_1f8 = (Diligent)0x27;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_1f8,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
        if (SignatureName != (char *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf," defined by signature \'",0x17);
          sVar4 = strlen(SignatureName);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,SignatureName,sVar4);
          msg._M_dataplus._M_p._0_1_ = 0x27;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8[0]._M_local_buf,(char *)&msg,1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8[0]._M_local_buf,". The new range [",0x11);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,") does not match current range [",0x20);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,
                   "). This is treated as binding a new resource even if the buffer itself stays the same. Use another SRB or label the variable as dynamic, or use SetBufferOffset() method if you only need to change the offset."
                   ,0xcf);
        std::__cxx11::stringbuf::str();
        FormatString<std::__cxx11::string>(&msg,&local_1f8,Args_02);
        if ((long *)CONCAT71(acStack_1f7._0_7_,local_1f8) != local_1e8) {
          operator_delete((long *)CONCAT71(acStack_1f7._0_7_,local_1f8),local_1e8[0] + 1);
        }
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyConstantBufferBinding",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                   ,0x132);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
      }
    }
  }
  return bVar3;
}

Assistant:

bool VerifyConstantBufferBinding(const PipelineResourceDesc& ResDesc,
                                 const BindResourceInfo&     BindInfo,
                                 const BufferImplType*       pBufferImpl,
                                 const IDeviceObject*        pCachedBuffer,
                                 Uint64                      CachedBaseOffset,
                                 Uint64                      CachedRangeSize,
                                 const char*                 SignatureName)
{
    bool BindingOK = VerifyResourceBinding("buffer", ResDesc, BindInfo, pBufferImpl, pCachedBuffer, SignatureName);

    if (pBufferImpl != nullptr)
    {
        const BufferDesc& BuffDesc = pBufferImpl->GetDesc();
        if ((BuffDesc.BindFlags & BIND_UNIFORM_BUFFER) == 0)
        {
            std::stringstream ss;
            ss << "Error binding buffer '" << BuffDesc.Name << "' to variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
            if (SignatureName != nullptr)
            {
                ss << " defined by signature '" << SignatureName << '\'';
            }
            ss << ". The buffer was not created with BIND_UNIFORM_BUFFER flag.";
            RESOURCE_VALIDATION_FAILURE(ss.str());

            BindingOK = false;
        }

        if (BuffDesc.Usage == USAGE_DYNAMIC && (ResDesc.Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) != 0)
        {
            std::stringstream ss;
            ss << "Error binding USAGE_DYNAMIC buffer '" << BuffDesc.Name << "' to variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
            if (SignatureName != nullptr)
            {
                ss << " defined by signature '" << SignatureName << '\'';
            }
            ss << ". The variable was initialized with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag.";
            RESOURCE_VALIDATION_FAILURE(ss.str());

            BindingOK = false;
        }

        bool RangeIsOutOfBounds = false;
        if (BindInfo.BufferBaseOffset + BindInfo.BufferRangeSize > BuffDesc.Size)
        {
            RESOURCE_VALIDATION_FAILURE("Buffer range [", BindInfo.BufferBaseOffset, ", ", BindInfo.BufferBaseOffset + BindInfo.BufferRangeSize,
                                        ") specified for buffer '", BuffDesc.Name, "' of size ", BuffDesc.Size, " is out of the buffer bounds.");
            BindingOK          = false;
            RangeIsOutOfBounds = true;
        }

        const Uint32 OffsetAlignment = pBufferImpl->GetDevice()->GetAdapterInfo().Buffer.ConstantBufferOffsetAlignment;
        VERIFY_EXPR(OffsetAlignment != 0);
        if ((BindInfo.BufferBaseOffset % OffsetAlignment) != 0)
        {
            RESOURCE_VALIDATION_FAILURE("Buffer base offset (", BindInfo.BufferBaseOffset, ") is not a multiple of required constant buffer offset alignment (",
                                        OffsetAlignment, ").");
            BindingOK = false;
        }

        if (!RangeIsOutOfBounds && ResDesc.VarType != SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC && pCachedBuffer != nullptr)
        {
            if (CachedRangeSize == 0)
                CachedRangeSize = BuffDesc.Size - CachedBaseOffset;
            Uint64 NewBufferRangeSize = BindInfo.BufferRangeSize;
            if (NewBufferRangeSize == 0)
                NewBufferRangeSize = BuffDesc.Size - BindInfo.BufferBaseOffset;

            if (CachedBaseOffset != BindInfo.BufferBaseOffset ||
                CachedRangeSize != NewBufferRangeSize)
            {
                std::stringstream ss;
                ss << "Error binding buffer '" << BuffDesc.Name << "' to variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
                if (SignatureName != nullptr)
                {
                    ss << " defined by signature '" << SignatureName << '\'';
                }
                ss << ". The new range [" << BindInfo.BufferBaseOffset << ", " << BindInfo.BufferBaseOffset + NewBufferRangeSize
                   << ") does not match current range [" << CachedBaseOffset << ", " << CachedBaseOffset + CachedRangeSize
                   << "). This is treated as binding a new resource even if the buffer itself stays the same. "
                      "Use another SRB or label the variable as dynamic, or use SetBufferOffset() method if you only need to change the offset.";
                RESOURCE_VALIDATION_FAILURE(ss.str());
            }
        }
    }
    else
    {
        if (BindInfo.BufferBaseOffset != 0 || BindInfo.BufferRangeSize != 0)
            RESOURCE_VALIDATION_FAILURE("Non-empty buffer range is specified for a null buffer.");
    }

    return BindingOK;
}